

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::activatePipelineStack
          (QPDFWriter *this,PipelinePopper *pp,bool discard,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  unsigned_long *puVar1;
  Link *pLVar2;
  element_type *peVar3;
  unsigned_long uVar4;
  Count *pCVar5;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> *this_00;
  Count *c;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_40;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_38;
  
  pLVar2 = (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
           _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  if (pLVar2 == (Link *)0x0) {
    if (discard) {
      pCVar5 = (Count *)operator_new(0x58);
      ::qpdf::pl::Count::Count
                (pCVar5,((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->next_stack_id,(Pipeline *)0x0);
      c = pCVar5;
      goto LAB_001b4742;
    }
    pCVar5 = (Count *)operator_new(0x58);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = peVar3->next_stack_id;
    c = pCVar5;
    if (str == (string *)0x0) {
      ::qpdf::pl::Count::Count
                (pCVar5,uVar4,
                 (*(pointer *)
                   ((long)&(peVar3->pipeline_stack).
                           super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
                           super__Vector_impl_data + 8))[-1]);
      goto LAB_001b4742;
    }
    local_40._M_head_impl = (Link *)0x0;
    ::qpdf::pl::Count::Count
              (pCVar5,uVar4,str,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_40);
    this_00 = &local_40;
  }
  else {
    pCVar5 = (Count *)operator_new(0x58);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = peVar3->next_stack_id;
    (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
    local_38._M_head_impl = pLVar2;
    ::qpdf::pl::Count::Count
              (pCVar5,uVar4,&peVar3->count_buffer,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_38);
    this_00 = &local_38;
    c = pCVar5;
  }
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)this_00);
LAB_001b4742:
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp->stack_id = peVar3->next_stack_id;
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar3->pipeline_stack,&c);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->pipeline = c;
  puVar1 = &peVar3->next_stack_id;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
QPDFWriter::activatePipelineStack(
    PipelinePopper& pp, bool discard, std::string* str, std::unique_ptr<pl::Link> link)
{
    pl::Count* c;
    if (link) {
        c = new pl::Count(m->next_stack_id, m->count_buffer, std::move(link));
    } else if (discard) {
        c = new pl::Count(m->next_stack_id, nullptr);
    } else if (!str) {
        c = new pl::Count(m->next_stack_id, m->pipeline_stack.back());
    } else {
        c = new pl::Count(m->next_stack_id, *str);
    }
    pp.stack_id = m->next_stack_id;
    m->pipeline_stack.emplace_back(c);
    m->pipeline = c;
    ++m->next_stack_id;
}